

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool tinyusdz::anon_unknown_160::IsMtlxFileFormat(string *name)

{
  int iVar1;
  string ext;
  string local_30;
  
  GetExtension(&local_30,name);
  iVar1 = ::std::__cxx11::string::compare((char *)&local_30);
  ::std::__cxx11::string::_M_dispose();
  return iVar1 == 0;
}

Assistant:

bool IsMtlxFileFormat(const std::string &name) {
  std::string ext = GetExtension(name);

  return ext.compare("mtlx") == 0;
}